

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

int stbtt__close_shape(stbtt_vertex *vertices,int num_vertices,int was_off,int start_off,
                      stbtt_int32 sx,stbtt_int32 sy,stbtt_int32 scx,stbtt_int32 scy,stbtt_int32 cx,
                      stbtt_int32 cy)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  stbtt_int32 in_R8D;
  stbtt_int32 in_R9D;
  int in_stack_00000008;
  undefined4 local_c;
  
  if (in_ECX == 0) {
    if (in_EDX == 0) {
      stbtt_setvertex((stbtt_vertex *)(in_RDI + (long)in_ESI * 0xe),'\x02',in_R8D,in_R9D,0,0);
    }
    else {
      stbtt_setvertex((stbtt_vertex *)(in_RDI + (long)in_ESI * 0xe),'\x03',in_R8D,in_R9D,was_off,
                      (int)vertices);
    }
    local_c = in_ESI + 1;
  }
  else {
    local_c = in_ESI;
    if (in_EDX != 0) {
      local_c = in_ESI + 1;
      stbtt_setvertex((stbtt_vertex *)(in_RDI + (long)in_ESI * 0xe),'\x03',
                      was_off + in_stack_00000008 >> 1,(int)vertices + sx >> 1,was_off,(int)vertices
                     );
    }
    stbtt_setvertex((stbtt_vertex *)(in_RDI + (long)local_c * 0xe),'\x03',in_R8D,in_R9D,
                    in_stack_00000008,sx);
    local_c = local_c + 1;
  }
  return local_c;
}

Assistant:

static int stbtt__close_shape(stbtt_vertex *vertices, int num_vertices, int was_off, int start_off,
    stbtt_int32 sx, stbtt_int32 sy, stbtt_int32 scx, stbtt_int32 scy, stbtt_int32 cx, stbtt_int32 cy)
{
   if (start_off) {
      if (was_off)
         stbtt_setvertex(&vertices[num_vertices++], STBTT_vcurve, (cx+scx)>>1, (cy+scy)>>1, cx,cy);
      stbtt_setvertex(&vertices[num_vertices++], STBTT_vcurve, sx,sy,scx,scy);
   } else {
      if (was_off)
         stbtt_setvertex(&vertices[num_vertices++], STBTT_vcurve,sx,sy,cx,cy);
      else
         stbtt_setvertex(&vertices[num_vertices++], STBTT_vline,sx,sy,0,0);
   }
   return num_vertices;
}